

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

Maybe<unsigned_int> __thiscall
kj::parse::Many_<kj::parse::ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_>,_false>::
Impl<capnp::compiler::Lexer::ParserInput,_kj::_::Tuple<>_>::apply
          (Impl<capnp::compiler::Lexer::ParserInput,_kj::_::Tuple<>_> *this,
          ConstResult_<kj::parse::CharGroup_,_kj::_::Tuple<>_> *subParser,ParserInput *input)

{
  ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>> CVar1;
  int iVar2;
  ParserInput subInput;
  ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>> local_62 [2];
  NullableValue<unsigned_int> local_60;
  IteratorInput<char,_const_char_*> local_58;
  char *local_38;
  
  iVar2 = 0;
  local_60 = (NullableValue<unsigned_int>)this;
  do {
    local_58.pos = (input->super_IteratorInput<char,_const_char_*>).pos;
    local_58.end = (input->super_IteratorInput<char,_const_char_*>).end;
    if (local_58.pos == local_58.end) break;
    local_38 = input->begin;
    local_58.parent = &input->super_IteratorInput<char,_const_char_*>;
    local_58.best = local_58.pos;
    ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>::operator()
              (local_62,(ParserInput *)subParser);
    CVar1 = local_62[0];
    if (local_62[0] == (ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>)0x1) {
      ((IteratorInput<char,_const_char_*> *)&(local_58.parent)->parent)->pos = local_58.pos;
      iVar2 = iVar2 + 1;
    }
    IteratorInput<char,_const_char_*>::~IteratorInput(&local_58);
  } while (CVar1 != (ConstResult_<kj::parse::CharGroup_,kj::_::Tuple<>>)0x0);
  *(undefined1 *)local_60 = 1;
  *(int *)((long)local_60 + 4) = iVar2;
  return (Maybe<unsigned_int>)local_60;
}

Assistant:

static Maybe<uint> apply(const SubParser& subParser, Input& input) {
    uint count = 0;

    while (!input.atEnd()) {
      Input subInput(input);

      if (kj::none != subParser(subInput)) {
        subInput.advanceParent();
        ++count;
      } else {
        break;
      }
    }

    if (atLeastOne && count == 0) {
      return kj::none;
    }

    return count;
  }